

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

ssize_t iso9660_write_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  mode_t mVar2;
  ssize_t sVar3;
  
  pvVar1 = a->format_data;
  if ((*(long *)((long)pvVar1 + 0x10) != 0) &&
     (mVar2 = archive_entry_filetype(*(archive_entry **)(*(long *)((long)pvVar1 + 0x10) + 0x20)),
     mVar2 == 0x8000)) {
    if (*(ulong *)((long)pvVar1 + 0x38) < s) {
      s = *(ulong *)((long)pvVar1 + 0x38);
    }
    if (s != 0) {
      sVar3 = write_iso9660_data(a,buff,s);
      if (sVar3 < 1) {
        return sVar3;
      }
      *(long *)((long)pvVar1 + 0x38) = *(long *)((long)pvVar1 + 0x38) - sVar3;
      return sVar3;
    }
  }
  return 0;
}

Assistant:

static ssize_t
iso9660_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	ssize_t r;

	if (iso9660->cur_file == NULL)
		return (0);
	if (archive_entry_filetype(iso9660->cur_file->entry) != AE_IFREG)
		return (0);
	if (s > iso9660->bytes_remaining)
		s = (size_t)iso9660->bytes_remaining;
	if (s == 0)
		return (0);

	r = write_iso9660_data(a, buff, s);
	if (r > 0)
		iso9660->bytes_remaining -= r;
	return (r);
}